

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KNNValidatorTests.cpp
# Opt level: O0

int testKNNValidatorNoK(void)

{
  ostream *poVar1;
  Result local_80;
  KNearestNeighborsClassifier *nnModel;
  undefined1 local_40 [8];
  Model m1;
  
  CoreML::Specification::Model::Model((Model *)local_40);
  CoreML::KNNValidatorTests::generateInterface((Model *)local_40);
  local_80.m_message._M_storage._M_storage =
       (uchar  [8])
       CoreML::Specification::Model::mutable_knearestneighborsclassifier((Model *)local_40);
  CoreML::KNNValidatorTests::addDataPoints
            ((KNearestNeighborsClassifier *)local_80.m_message._M_storage._M_storage);
  CoreML::KNNValidatorTests::addStringLabels
            ((KNearestNeighborsClassifier *)local_80.m_message._M_storage._M_storage);
  CoreML::validate<(MLModelType)404>(&local_80,(Model *)local_40);
  m1._oneof_case_[0]._0_1_ = CoreML::Result::good(&local_80);
  if (m1._oneof_case_[0]._0_1_) {
    poVar1 = std::operator<<((ostream *)&std::cout,
                             "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/KNNValidatorTests.cpp"
                            );
    poVar1 = std::operator<<(poVar1,":");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,0x97);
    poVar1 = std::operator<<(poVar1,": error: ");
    poVar1 = std::operator<<(poVar1,"!((res).good())");
    poVar1 = std::operator<<(poVar1," was false, expected true.");
    std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  }
  m1._oneof_case_[0]._1_3_ = 0;
  CoreML::Result::~Result(&local_80);
  CoreML::Specification::Model::~Model((Model *)local_40);
  return m1._oneof_case_[0];
}

Assistant:

int testKNNValidatorNoK() {

    Specification::Model m1;

    KNNValidatorTests::generateInterface(m1);

    auto *nnModel = m1.mutable_knearestneighborsclassifier();

    KNNValidatorTests::addDataPoints(nnModel);
    KNNValidatorTests::addStringLabels(nnModel);

    Result res = validate<MLModelType_kNearestNeighborsClassifier>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}